

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O3

void __thiscall rsg::ValueRange::~ValueRange(ValueRange *this)

{
  pointer pSVar1;
  
  pSVar1 = (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->m_max).
                                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  pSVar1 = (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->m_min).
                                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  VariableType::~VariableType(&this->m_type);
  return;
}

Assistant:

ValueRange::~ValueRange (void)
{
}